

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O1

Boolean MA_allocate_heap(Integer datatype,Integer nelem,char *name,Integer *memhandle)

{
  Pointer pcVar1;
  ulong uVar2;
  Integer IVar3;
  ulong uVar4;
  _AD **pp_Var5;
  _AD *ad;
  AD *pAVar6;
  char *pcVar7;
  Pointer client_space;
  ulongi nbytes;
  AR ar;
  Pointer local_58;
  ulong local_50;
  Integer *local_48;
  AR local_40;
  
  ma_stats.calls[1] = ma_stats.calls[1] + 1;
  if (ma_trace != 0) {
    printf("MA: allocating \'%s\' (%d)\n",name,nelem & 0xffffffff);
  }
  ad = ma_hfree;
  if (ma_initialized == '\0') {
    sprintf(ma_ebuf,"block \'%s\', MA not yet initialized",name);
  }
  else {
    uVar4 = datatype - 1000;
    if (uVar4 < 0x11) {
      if (nelem < 0) {
        pcVar7 = "block \'%s\', invalid nelem: %ld";
        local_50 = nelem;
      }
      else {
        local_40.datatype = uVar4;
        local_40.nelem = nelem;
        if (ma_hfree == (AD *)0x0) {
          ad = (AD *)0x0;
        }
        else {
          local_48 = memhandle;
          balloc_after(&local_40,(Pointer)ma_hfree,&local_58,&local_50);
          if (ad->nbytes < local_50) {
            do {
              pAVar6 = ad;
              ad = pAVar6->next;
              if (ad == (_AD *)0x0) {
                ad = (AD *)0x0;
                memhandle = local_48;
                goto LAB_00169d32;
              }
              balloc_after(&local_40,(Pointer)ad,&local_58,&local_50);
            } while (ad->nbytes < local_50);
          }
          else {
            pAVar6 = (AD *)0x0;
          }
          block_split(ad,local_50,1);
          ad->client_space = local_58;
          pp_Var5 = &ma_hfree;
          if (pAVar6 != (AD *)0x0) {
            pp_Var5 = &pAVar6->next;
          }
          *pp_Var5 = ad->next;
          memhandle = local_48;
        }
LAB_00169d32:
        pcVar1 = ma_hp;
        if (ad != (AD *)0x0) {
LAB_00169d94:
          ad->datatype = uVar4;
          ad->nelem = nelem;
          pcVar7 = ad->name;
          if (name != (char *)0x0) {
            strncpy(pcVar7,name,0x20);
            pcVar7 = ad->name + 0x1f;
          }
          *pcVar7 = '\0';
          ad->next = ma_hused;
          pcVar1 = ad->client_space;
          ma_hused = ad;
          ad->checksum = (ulongi)(pcVar1 + ad->nbytes + ad->nelem + ad->datatype);
          pcVar1[-4] = -0x56;
          pcVar1[-3] = -0x56;
          pcVar1[-2] = -0x56;
          pcVar1[-1] = -0x56;
          builtin_strncpy(ad->client_space + (long)ma_sizeof[ad->datatype] * ad->nelem,"UUUU",4);
          if (ma_hp < ad->name + (ad->nbytes - 0x10)) {
            ma_hp = ad->name + (ad->nbytes - 0x10);
          }
          ma_stats.hblocks = ma_stats.hblocks + 1;
          uVar4 = ma_stats.hblocks;
          if (ma_stats.hblocks < ma_stats.hblocks_max) {
            uVar4 = ma_stats.hblocks_max;
          }
          ma_stats.hbytes = ad->nbytes + ma_stats.hbytes;
          uVar2 = ma_stats.hbytes;
          if (ma_stats.hbytes < ma_stats.hbytes_max) {
            uVar2 = ma_stats.hbytes_max;
          }
          ma_stats.hblocks_max = uVar4;
          ma_stats.hbytes_max = uVar2;
          IVar3 = ma_table_allocate((TableData)ad);
          *memhandle = IVar3;
          return (ulong)(IVar3 != -1);
        }
        balloc_after(&local_40,ma_hp,&local_58,&local_50);
        if (pcVar1 + local_50 <= ma_sp) {
          *(Pointer *)(pcVar1 + 0x30) = local_58;
          *(ulong *)(pcVar1 + 0x38) = local_50;
          ad = (_AD *)pcVar1;
          goto LAB_00169d94;
        }
        pcVar7 = "block \'%s\', not enough space to allocate %lu bytes";
      }
      sprintf(ma_ebuf,pcVar7,name,local_50);
    }
    else {
      sprintf(ma_ebuf,"block \'%s\', invalid datatype: %ld",name,datatype);
    }
  }
  ma_error(EL_Nonfatal,ET_External,"MA_allocate_heap",ma_ebuf);
  return 0;
}

Assistant:

public Boolean MA_allocate_heap(
    Integer    datatype,    /* of elements in this block */
    Integer    nelem,        /* # of elements in this block */
    const char    *name,        /* assigned to this block by client */
    Integer    *memhandle    /* RETURN: handle for this block */ )
{
    AR        ar;        /* allocation request */
    AD        *ad;        /* AD for newly allocated block */
    Pointer    client_space;    /* location of client_space */
    ulongi    nbytes;        /* length of block for ar */
    Pointer    new_hp;        /* new ma_hp */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_allocate_heap]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return MA_FALSE;
#endif /* VERIFY */

    if (ma_trace) 
    (void)printf("MA: allocating '%s' (%d)\n", name, (int)nelem);

    /* verify initialization */
    if (!ma_initialized)
    {
        (void)sprintf(ma_ebuf,
            "block '%s', MA not yet initialized",
            name);
        ma_error(EL_Nonfatal, ET_External, "MA_allocate_heap", ma_ebuf);
        return MA_FALSE;
    }

    /* verify datatype */
    if (!mt_valid(datatype))
    {
        (void)sprintf(ma_ebuf,
            "block '%s', invalid datatype: %ld",
            name, (size_t)datatype);
        ma_error(EL_Nonfatal, ET_External, "MA_allocate_heap", ma_ebuf);
        return MA_FALSE;
    }

    /* verify nelem */
    if (nelem < 0)
    {
        (void)sprintf(ma_ebuf,
            "block '%s', invalid nelem: %ld",
            name, (size_t)nelem);
        ma_error(EL_Nonfatal, ET_External, "MA_allocate_heap", ma_ebuf);
        return MA_FALSE;
    }

    /* convert datatype to internal (index-suitable) value */
    datatype = mt_import(datatype);

    /*
     * attempt to allocate space
     */

    ar.datatype = datatype;
    ar.nelem = nelem;

    /* search the free list */
    ad = list_delete_one(&ma_hfree, ad_big_enough, (Pointer)&ar);

    /* if search of free list failed, try expanding heap region */
    if (ad == (AD *)NULL)
    {
        /* perform trial allocation to determine size */
        balloc_after(&ar, ma_hp, &client_space, &nbytes);

        new_hp = ma_hp + nbytes;
        if (new_hp > ma_sp)
        {
            (void)sprintf(ma_ebuf,
                "block '%s', not enough space to allocate %lu bytes",
                name, nbytes);
            ma_error(EL_Nonfatal, ET_External, "MA_allocate_heap", ma_ebuf);
            return MA_FALSE;
        }
        else
        {
            /* heap region expanded successfully */
            ad = (AD *)ma_hp;

            /* set fields appropriately */
            ad->client_space = client_space;
            ad->nbytes = nbytes;
        }
    }

    /*
     * space has been allocated
     */

    /* initialize the AD */
    ad->datatype = datatype;
    ad->nelem = nelem;
    str_ncopy(ad->name, (char*)name, MA_NAMESIZE);
    /* ad->client_space is already set */
    /* ad->nbytes is already set */
    list_insert(ad, &ma_hused);
    ad->checksum = checksum(ad);

    /* set the guards */
    guard_set(ad);

#ifdef DEBUG
    debug_ad_print(ad);
#endif /* DEBUG */

    /* update ma_hp if necessary */
    new_hp = (Pointer)ad + ad->nbytes;
    if (new_hp > ma_hp)
    {
        ma_hp = new_hp;
    }

#ifdef STATS
    ma_stats.hblocks++;
    ma_stats.hblocks_max = max(ma_stats.hblocks, ma_stats.hblocks_max);
    ma_stats.hbytes += ad->nbytes;
    ma_stats.hbytes_max = max(ma_stats.hbytes, ma_stats.hbytes_max);
#endif /* STATS */

    /* convert AD to memhandle */
    if ((*memhandle = ma_table_allocate((TableData)ad)) == TABLE_HANDLE_NONE)
        /* failure */
        return MA_FALSE;
    else
        /* success */
        return MA_TRUE;
}